

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall
fizplex::LPTest_GetValueWhenNoValueWasAddedIsZero_Test::TestBody
          (LPTest_GetValueWhenNoValueWasAddedIsZero_Test *this)

{
  char *message;
  double rhs_value;
  AssertHelper local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertionResult gtest_ar;
  LP lp;
  
  LP::LP(&lp);
  LP::add_column(&lp,Bounded,0.0,5.0,0.0);
  LP::add_row(&lp,Range,3.0,15.0);
  rhs_value = LP::get_value(&lp,0,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar,"0.0","lp.get_value(0, 0)",0.0,rhs_value);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x70,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  LP::~LP(&lp);
  return;
}

Assistant:

TEST(LPTest, GetValueWhenNoValueWasAddedIsZero) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Range, 3, 15);
  EXPECT_DOUBLE_EQ(0.0, lp.get_value(0, 0));
}